

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

void STAT_StartNewGame(char *mapname)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  TArray<OneLevel,_OneLevel>::Clear(&LevelData);
  if ((deathmatch.Value == 0) && (multiplayer == false)) {
    uVar3 = 0xffffffffffffffff;
    lVar1 = -0x20;
    do {
      lVar4 = lVar1;
      uVar3 = uVar3 + 1;
      if (AllEpisodes.Count <= uVar3) {
        StartEpisode = (FEpisode *)0x0;
        return;
      }
      iVar2 = FString::CompareNoCase
                        ((FString *)((long)&AllEpisodes.Array[1].mEpisodeMap.Chars + lVar4),mapname)
      ;
      lVar1 = lVar4 + 0x20;
    } while (iVar2 != 0);
    StartEpisode = (FEpisode *)((long)&AllEpisodes.Array[1].mEpisodeName.Chars + lVar4);
  }
  else {
    StartEpisode = (FEpisode *)0x0;
  }
  return;
}

Assistant:

void STAT_StartNewGame(const char *mapname)
{
	LevelData.Clear();
	if (!deathmatch && !multiplayer)
	{
		for(unsigned int j=0;j<AllEpisodes.Size();j++)
		{
			if (!AllEpisodes[j].mEpisodeMap.CompareNoCase(mapname))
			{
				StartEpisode = &AllEpisodes[j];
				return;
			}
		}
	}
	StartEpisode = NULL;
}